

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void makeniche(level *lev,int trap_type)

{
  char cVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  trap *ptVar6;
  permonst *ptr;
  xchar y;
  long lVar7;
  uint y_00;
  uint uVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  int iVar10;
  mkroom *aroom;
  coord dd;
  coord local_4a;
  ulong local_48;
  rm (*local_40) [21];
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000034,trap_type);
  if (lev->doorindex < 0x78) {
    local_40 = lev->locations;
    iVar10 = -8;
    do {
      iVar4 = lev->nroom;
      uVar3 = mt_random();
      lVar7 = SUB168(ZEXT416(uVar3) % SEXT816((long)iVar4),0);
      if ((lev->rooms[lVar7].rtype == '\0') &&
         ((aroom = lev->rooms + lVar7, aroom->doorct != '\x01' ||
          (uVar3 = mt_random(), uVar3 * -0x33333333 < 0x33333334)))) {
        uVar3 = mt_random();
        if ((uVar3 & 1) == 0) {
          cVar1 = aroom->ly + -1;
          finddpos(lev,&local_4a,aroom->lx,cVar1,aroom->hx,cVar1);
          iVar4 = -1;
        }
        else {
          cVar1 = aroom->hy + '\x01';
          finddpos(lev,&local_4a,aroom->lx,cVar1,aroom->hx,cVar1);
          iVar4 = 1;
        }
        uVar9 = local_38;
        uVar3 = (uint)local_4a.x;
        if (uVar3 - 1 < 0x4f) {
          uVar8 = (uint)local_4a.y;
          local_48 = (ulong)uVar8;
          y_00 = iVar4 + uVar8;
          if ((((y_00 < 0x15) && (local_40[uVar3][y_00].typ == '\0')) &&
              (uVar8 = uVar8 - iVar4, uVar8 < 0x15)) &&
             ((cVar1 = local_40[uVar3][uVar8].typ, 3 < (byte)(cVar1 - 0x11U) &&
              (7 < (byte)(cVar1 - 0x1aU))))) {
            if ((int)local_38 == 0) {
              uVar8 = mt_random();
              if ((uVar8 & 3) != 0) {
                lev->locations[(int)uVar3][(int)y_00].typ = '\x18';
                uVar8 = mt_random();
                uVar5 = mt_random();
                if (uVar8 * -0x49249249 < 0x24924925) {
                  if ((uVar5 & 7) == 0) {
                    cVar1 = local_40[(int)uVar3][(int)local_48].typ;
                    if (cVar1 < '\r' && cVar1 != '\0') {
                      local_40[(int)uVar3][(int)local_48].typ = '\x16';
                      uVar8 = mt_random();
                      if (0x55555555 < uVar8 * -0x55555555) {
                        ptr = mkclass(&lev->z,'5',0);
                        mkcorpstat(0x10e,(monst *)0x0,ptr,lev,uVar3,y_00,'\x01');
                      }
                    }
                  }
                  if (((lev->flags).field_0x9 & 8) == 0) {
                    mksobj_at(0x15c,lev,uVar3,y_00,'\x01','\0');
                  }
                  uVar8 = mt_random();
                  if (0x55555555 < uVar8 * -0x55555555) {
                    return;
                  }
                  mkobj_at('\0',lev,uVar3,y_00,'\x01');
                  return;
                }
                iVar10 = (uint)(uVar5 * -0x33333333 < 0x33333334) * 8 + 0xf;
                y = (xchar)local_48;
                goto LAB_001da622;
              }
              lev->locations[(int)uVar3][(int)y_00].typ = '\x10';
            }
            else {
              lev->locations[(int)uVar3][(int)y_00].typ = '\x10';
              if ((int)local_38 - 0xdU < 2) {
                bVar2 = can_fall_thru(lev);
                uVar9 = uVar9 & 0xffffffff;
                if (bVar2 == '\0') {
                  uVar9 = 3;
                }
              }
              ptVar6 = maketrap(lev,uVar3,y_00,(int)uVar9);
              if (ptVar6 != (trap *)0x0) {
                if ((int)uVar9 != 3) {
                  ptVar6->field_0x8 = ptVar6->field_0x8 | 0x40;
                }
                if ((0x1fcbfffUL >> (uVar9 & 0x3f) & 1) == 0) {
                  make_engr_at(lev,uVar3,uVar8,trap_engravings[uVar9 & 0xffffffff],0,'\x01');
                  wipe_engr_at(lev,local_4a.x,(xchar)uVar8,'\x05');
                }
              }
            }
            y = (xchar)local_48;
            iVar10 = 0xf;
LAB_001da622:
            dosdoor(lev,local_4a.x,y,aroom,iVar10);
            return;
          }
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
  }
  return;
}

Assistant:

static void makeniche(struct level *lev, int trap_type)
{
	struct mkroom *aroom;
	struct rm *rm;
	int vct = 8;
	int dy, xx, yy;
	struct trap *ttmp;

	if (lev->doorindex < DOORMAX)
	  while (vct--) {
	    aroom = &lev->rooms[rn2(lev->nroom)];
	    if (aroom->rtype != OROOM) continue;	/* not an ordinary room */
	    if (aroom->doorct == 1 && rn2(5)) continue;
	    if (!place_niche(lev, aroom, &dy, &xx, &yy)) continue;

	    rm = &lev->locations[xx][yy+dy];
	    if (trap_type || !rn2(4)) {

		rm->typ = SCORR;
		if (trap_type) {
		    if ((trap_type == HOLE || trap_type == TRAPDOOR)
			&& !can_fall_thru(lev))
			trap_type = ROCKTRAP;
		    ttmp = maketrap(lev, xx, yy+dy, trap_type);
		    if (ttmp) {
			if (trap_type != ROCKTRAP) ttmp->once = 1;
			if (trap_engravings[trap_type]) {
			    make_engr_at(lev, xx, yy-dy,
				     trap_engravings[trap_type], 0L, DUST);
			    wipe_engr_at(lev, xx, yy-dy, 5); /* age it a little */
			}
		    }
		}
		dosdoor(lev, xx, yy, aroom, SDOOR);
	    } else {
		rm->typ = CORR;
		if (rn2(7)) {
		    dosdoor(lev, xx, yy, aroom, rn2(5) ? SDOOR : DOOR);
		} else {
		    /* inaccessible niches occasionally have iron bars */
		    if (!rn2(8) && IS_WALL(lev->locations[xx][yy].typ)) {
			lev->locations[xx][yy].typ = IRONBARS;
			if (rn2(3)) {
			    mkcorpstat(CORPSE, NULL, mkclass(&lev->z, S_HUMAN, 0),
				       lev, xx, yy + dy, TRUE);
			}
		    }
		    if (!lev->flags.noteleport)
			mksobj_at(SCR_TELEPORTATION, lev,
					 xx, yy+dy, TRUE, FALSE);
		    if (!rn2(3)) mkobj_at(0, lev, xx, yy+dy, TRUE);
		}
	    }
	    return;
	}
}